

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall slang::ast::Scope::addMembers(Scope *this,SyntaxNode *syntax)

{
  int *piVar1;
  SyntaxKind SVar2;
  Symbol *member;
  Symbol *at;
  SyntaxNode *pSVar3;
  undefined1 auVar4 [16];
  pointer ppSVar5;
  bool bVar6;
  int iVar7;
  ConfigBlockSymbol *member_00;
  uint *puVar8;
  DeferredMemberData *pDVar9;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar10;
  ExplicitImportSymbol *this_00;
  SourceLocation SVar11;
  string_view *psVar12;
  CovergroupType *member_01;
  ulong uVar13;
  Scope *unaff_RBX;
  char *pcVar14;
  SmallVector<slang::ast::VariableSymbol_*,_5UL> *__range3;
  ForwardingTypedefSymbol *pFVar15;
  ForwardingTypedefSymbol *pFVar16;
  ForwardingTypedefSymbol *pFVar17;
  ElabSystemTaskSyntax *syntax_00;
  Compilation *compilation;
  Token *this_01;
  long unaff_R12;
  long lVar18;
  long lVar19;
  ulong uVar20;
  Scope *unaff_R13;
  PackageImportDeclarationSyntax *importDecl;
  ForwardingTypedefSymbol *unaff_R15;
  LookupLocation location;
  pair<slang::ast::SubroutineSymbol_*,_bool> pVar21;
  Token TVar22;
  SmallVector<slang::ast::VariableSymbol_*,_5UL> symbols;
  SmallVectorBase<const_slang::ast::SpecparamSymbol_*> local_98 [2];
  string_view local_58;
  SyntaxNode *local_48;
  SourceLocation local_40;
  Compilation *local_38;
  
  pFVar16 = (ForwardingTypedefSymbol *)local_98;
  pFVar15 = (ForwardingTypedefSymbol *)local_98;
  pFVar17 = (ForwardingTypedefSymbol *)local_98;
  syntax_00 = (ElabSystemTaskSyntax *)syntax->previewNode;
  compilation = (Compilation *)this;
  if (syntax_00 != (ElabSystemTaskSyntax *)0x0) {
    addMembers(this,(SyntaxNode *)syntax_00);
  }
  SVar2 = syntax->kind;
  puVar8 = (uint *)(ulong)SVar2;
  if ((int)SVar2 < 0xcb) {
    if (0x43 < (int)SVar2) {
switchD_0033e46e_caseD_81:
      iVar7 = (int)puVar8;
      if (iVar7 < 0xa4) goto code_r0x0033e45d;
      if (iVar7 == 0xa4) {
        compilation = this->compilation;
        syntax_00 = (ElabSystemTaskSyntax *)syntax;
        goto switchD_0033e46e_caseD_94;
      }
      if (iVar7 != 0xae) {
        addDeferredMembers(this,syntax);
        pDVar9 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
        pDVar9->hasEnums = true;
        return;
      }
      member_00 = (ConfigBlockSymbol *)
                  EmptyMemberSymbol::fromSyntax(this->compilation,this,(EmptyMemberSyntax *)syntax);
      goto LAB_0033e5b0;
    }
    if (0xf < (int)SVar2) {
      if (((int)SVar2 < 0x34) || (SVar2 != BinsSelection)) goto switchD_0033e5f2_caseD_142;
      member_00 = (ConfigBlockSymbol *)
                  CoverageBinSymbol::fromSyntax(this,(BinsSelectionSyntax *)syntax);
      goto LAB_0033e5b0;
    }
    if (3 < SVar2 - AlwaysBlock) {
      member_00 = (ConfigBlockSymbol *)
                  AnonymousProgramSymbol::fromSyntax(this,(AnonymousProgramSyntax *)syntax);
      goto LAB_0033e5b0;
    }
switchD_0033e540_caseD_cf:
    member_00 = (ConfigBlockSymbol *)
                ProceduralBlockSymbol::fromSyntax(this,(ProceduralBlockSyntax *)syntax);
LAB_0033e5b0:
    insertMember(this,&member_00->super_Symbol,this->lastMember,false,true);
    return;
  }
  if ((int)SVar2 < 0x157) {
    if ((int)SVar2 < 0xee) {
      puVar8 = &switchD_0033e540::switchdataD_004cd2c4;
      switch(SVar2) {
      case ExternInterfaceMethod:
        member_00 = (ConfigBlockSymbol *)
                    MethodPrototypeSymbol::fromSyntax(this,(ExternInterfaceMethodSyntax *)syntax);
        break;
      case ExternModuleDecl:
      case ExternUdpDecl:
        Compilation::noteExternDefinition(this->compilation,this,syntax);
        return;
      case FilePathSpec:
      case FirstMatchSequenceExpr:
      case FollowedByPropertyExpr:
      case ForLoopStatement:
      case ForVariableDeclaration:
      case ForeachLoopList:
      case ForeachLoopStatement:
      case ForeverStatement:
      case ForwardTypeRestriction:
      case FunctionPort:
      case FunctionPortList:
      case FunctionPrototype:
      case GreaterThanEqualExpression:
      case GreaterThanExpression:
      case HierarchicalInstance:
switchD_0033e5f2_caseD_144:
        if ((SyntaxNode *)local_98[0].data_ != syntax) {
          operator_delete(local_98[0].data_);
        }
        _Unwind_Resume(puVar8);
      case FinalBlock:
        goto switchD_0033e540_caseD_cf;
      case ForwardTypedefDeclaration:
        local_98[0].data_ =
             (pointer)ForwardingTypedefSymbol::fromSyntax
                                (this,(ForwardTypedefDeclarationSyntax *)syntax);
LAB_0033edad:
        insertMember(this,(Symbol *)local_98[0].data_,this->lastMember,false,true);
        pDVar9 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
        std::
        vector<slang::ast::ForwardingTypedefSymbol_const*,std::allocator<slang::ast::ForwardingTypedefSymbol_const*>>
        ::emplace_back<slang::ast::ForwardingTypedefSymbol_const*>
                  ((vector<slang::ast::ForwardingTypedefSymbol_const*,std::allocator<slang::ast::ForwardingTypedefSymbol_const*>>
                    *)&pDVar9->forwardingTypedefs,(ForwardingTypedefSymbol **)local_98);
        return;
      case FunctionDeclaration:
switchD_0033e540_caseD_d9:
        pVar21 = SubroutineSymbol::fromSyntax
                           (this->compilation,(FunctionDeclarationSyntax *)syntax,this,false);
        if (pVar21.first != (SubroutineSymbol *)0x0) {
          insertMember(this,&(pVar21.first)->super_Symbol,this->lastMember,false,true);
        }
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return;
        }
        pDVar9 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
        pDVar9->isUncacheable = true;
        return;
      case GenerateBlock:
      case HierarchyInstantiation:
        goto switchD_0033e5f2_caseD_142;
      case GenerateRegion:
        lVar19 = *(long *)(syntax + 6);
        if (lVar19 == 0) {
          return;
        }
        pSVar3 = syntax[5].previewNode;
        lVar18 = 0;
        do {
          addMembers(this,*(SyntaxNode **)((long)&pSVar3->kind + lVar18));
          lVar18 = lVar18 + 8;
        } while (lVar19 << 3 != lVar18);
        return;
      case GenvarDeclaration:
        unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
        local_98[0].len = 0;
        local_98[0].data_ = (pointer)unaff_R15;
        local_98[0].cap = 5;
        GenvarSymbol::fromSyntax
                  (this,(GenvarDeclarationSyntax *)syntax,
                   (SmallVectorBase<const_slang::ast::GenvarSymbol_*> *)local_98);
        pFVar17 = (ForwardingTypedefSymbol *)local_98;
        if ((char *)local_98[0].len != (char *)0x0) {
          ppSVar5 = local_98[0].data_;
          lVar19 = local_98[0].len << 3;
          lVar18 = 0;
          do {
            insertMember(this,*(Symbol **)((long)ppSVar5 + lVar18),this->lastMember,false,true);
            lVar18 = lVar18 + 8;
            pFVar17 = (ForwardingTypedefSymbol *)local_98;
          } while (lVar19 != lVar18);
        }
        goto LAB_0033ef8c;
      default:
        if (SVar2 == IfGenerate) goto switchD_0033e5f2_caseD_142;
        member_00 = (ConfigBlockSymbol *)
                    TimingPathSymbol::fromSyntax(this,(IfNonePathDeclarationSyntax *)syntax);
      }
      goto LAB_0033e5b0;
    }
code_r0x0033e40d:
    iVar7 = (int)puVar8;
    if (iVar7 < 0x12d) {
      if (0x10b < iVar7) {
        if (0x10e < iVar7) {
          if (iVar7 == 0x10f) {
            return;
          }
          goto switchD_0033e5f2_caseD_142;
        }
        if (iVar7 != 0x10c) {
          return;
        }
        member_00 = (ConfigBlockSymbol *)
                    LetDeclSymbol::fromSyntax(this,(LetDeclarationSyntax *)syntax);
        goto LAB_0033e5b0;
      }
      if (iVar7 == 0xee) {
        member_00 = (ConfigBlockSymbol *)
                    ProceduralBlockSymbol::fromSyntax(this,(ImmediateAssertionMemberSyntax *)syntax)
        ;
        goto LAB_0033e5b0;
      }
      if (iVar7 == 0xfb) goto switchD_0033e540_caseD_cf;
    }
    else {
      puVar8 = &switchD_0033e5f2::switchdataD_004cd328;
      switch(iVar7) {
      case 0x142:
      case 0x149:
        goto switchD_0033e5f2_caseD_142;
      case 0x143:
        unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
        local_98[0].len = 0;
        local_98[0].data_ = (pointer)unaff_R15;
        local_98[0].cap = 5;
        NetSymbol::fromSyntax
                  (this,(NetDeclarationSyntax *)syntax,
                   (SmallVectorBase<const_slang::ast::NetSymbol_*> *)local_98);
        pFVar17 = (ForwardingTypedefSymbol *)local_98;
        if ((char *)local_98[0].len != (char *)0x0) {
          ppSVar5 = local_98[0].data_;
          lVar19 = local_98[0].len << 3;
          lVar18 = 0;
          do {
            insertMember(this,*(Symbol **)((long)ppSVar5 + lVar18),this->lastMember,false,true);
            lVar18 = lVar18 + 8;
            pFVar17 = (ForwardingTypedefSymbol *)local_98;
          } while (lVar19 != lVar18);
        }
        goto LAB_0033ef8c;
      case 0x144:
      case 0x146:
      case 0x147:
      case 0x148:
        goto switchD_0033e5f2_caseD_144;
      case 0x145:
switchD_0033e5f2_caseD_145:
        member_00 = (ConfigBlockSymbol *)
                    NetType::fromSyntax(this,(NetTypeDeclarationSyntax *)syntax);
        goto LAB_0033e5b0;
      default:
        if (iVar7 == 0x12d) goto switchD_0033e5f2_caseD_142;
      }
    }
  }
  else {
    if (0x183 < (int)SVar2) {
      if (0x1ca < (int)SVar2) {
        if (0x1de < (int)SVar2) {
          if (SVar2 != UdpDeclaration) {
            if (SVar2 != UserDefinedNetDeclaration) {
              return;
            }
            handleUserDefinedNet(this,(UserDefinedNetDeclarationSyntax *)syntax);
            return;
          }
LAB_0033eb48:
          Compilation::createPrimitive(this->compilation,this,(UdpDeclarationSyntax *)syntax);
          return;
        }
        if (SVar2 == TaskDeclaration) goto switchD_0033e540_caseD_d9;
        if (SVar2 == TimeUnitsDeclaration) {
          return;
        }
        member_00 = (ConfigBlockSymbol *)
                    TypeAliasType::fromSyntax(this,(TypedefDeclarationSyntax *)syntax);
        goto LAB_0033e5b0;
      }
      if ((int)SVar2 < 0x1b3) {
        if (SVar2 == PulseStyleDeclaration) {
          member_00 = (ConfigBlockSymbol *)
                      PulseStyleSymbol::fromSyntax(this,(PulseStyleDeclarationSyntax *)syntax);
        }
        else {
          member_00 = (ConfigBlockSymbol *)
                      SequenceSymbol::fromSyntax(this,(SequenceDeclarationSyntax *)syntax);
        }
        goto LAB_0033e5b0;
      }
      if (SVar2 == SpecifyBlock) goto switchD_0033e5f2_caseD_142;
      if (SVar2 != SpecparamDeclaration) {
        member_00 = (ConfigBlockSymbol *)
                    SystemTimingCheckSymbol::fromSyntax(this,(SystemTimingCheckSyntax *)syntax);
        goto LAB_0033e5b0;
      }
      unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
      local_98[0].len = 0;
      local_98[0].data_ = (pointer)unaff_R15;
      local_98[0].cap = 5;
      SpecparamSymbol::fromSyntax(this,(SpecparamDeclarationSyntax *)syntax,local_98);
      pcVar14 = (char *)local_98[0].len;
      pFVar17 = (ForwardingTypedefSymbol *)local_98;
      if ((char *)local_98[0].len != (char *)0x0) {
code_r0x0033e6b0:
        ppSVar5 = local_98[0].data_;
        lVar19 = 0;
        do {
          insertMember(this,*(Symbol **)((long)ppSVar5 + lVar19),this->lastMember,false,true);
          lVar19 = lVar19 + 8;
          pFVar17 = (ForwardingTypedefSymbol *)local_98;
        } while ((long)pcVar14 * 8 != lVar19);
      }
      goto LAB_0033ef8c;
    }
    if ((int)SVar2 < 0x16b) {
      (*(code *)((long)&UINT_004cd348 + (long)(int)(&UINT_004cd348)[SVar2 - PackageDeclaration]))();
      return;
    }
    if ((int)SVar2 < 0x176) {
      if (SVar2 != PathDeclaration) {
        addDeferredMembers(this,syntax);
        pDVar9 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex);
        local_98[0].data_ = (pointer)this->lastMember;
        local_58._M_len = (size_t)syntax;
        std::
        vector<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>>>
        ::emplace_back<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*&>
                  ((vector<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>>>
                    *)&pDVar9->portDecls,(SyntaxNode **)&local_58,(Symbol **)local_98);
        return;
      }
      member_00 = (ConfigBlockSymbol *)
                  TimingPathSymbol::fromSyntax(this,(PathDeclarationSyntax *)syntax);
      goto LAB_0033e5b0;
    }
    if (SVar2 == PrimitiveInstantiation) goto switchD_0033e5f2_caseD_142;
    if (SVar2 != ProgramDeclaration) {
      member_00 = (ConfigBlockSymbol *)
                  PropertySymbol::fromSyntax(this,(PropertyDeclarationSyntax *)syntax);
      goto LAB_0033e5b0;
    }
  }
  if (this->lastMember == (Symbol *)0x0) {
    uVar13 = 1;
  }
  else {
    uVar13 = (ulong)(this->lastMember->indexInScope + 1);
  }
  location._8_8_ = uVar13;
  location.scope = this;
  Compilation::createDefinition(this->compilation,this,location,(ModuleDeclarationSyntax *)syntax);
  if ((this->thisSym->kind | Definition) == CompilationUnit) {
    return;
  }
  if (syntax->kind == InterfaceDeclaration) {
    return;
  }
switchD_0033e5f2_caseD_142:
  addDeferredMembers(this,syntax);
  return;
switchD_0033e46e_caseD_44:
  unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
  local_98[0].len = 0;
  local_98[0].data_ = (pointer)unaff_R15;
  local_98[0].cap = 5;
  VariableSymbol::fromSyntax
            (this->compilation,*(DataDeclarationSyntax **)(syntax + 4),this,true,
             (SmallVectorBase<slang::ast::VariableSymbol_*> *)local_98);
  unaff_RBX = (Scope *)local_98[0].len;
code_r0x0033e4a6:
  pFVar17 = pFVar15;
  if (unaff_RBX != (Scope *)0x0) {
    syntax = *(SyntaxNode **)&pFVar15->super_Symbol;
    unaff_RBX = (Scope *)((long)unaff_RBX << 3);
    pFVar16 = pFVar15;
code_r0x0033e4b7:
    lVar19 = 0;
    do {
      member = *(Symbol **)(lVar19 + (long)&syntax->kind);
      at = this->lastMember;
      *(undefined8 *)((long)pFVar16 + -8) = 0x33e4d2;
      insertMember(this,member,at,false,true);
      lVar19 = lVar19 + 8;
      pFVar17 = pFVar16;
    } while (unaff_RBX != (Scope *)lVar19);
  }
  goto LAB_0033ef8c;
code_r0x0033e45d:
  puVar8 = (uint *)((long)&switchD_0033e46e::switchdataD_004cd1d4 +
                   (long)(int)(&switchD_0033e46e::switchdataD_004cd1d4)[iVar7 - 0x44]);
  lVar19 = unaff_R12;
  switch(iVar7) {
  case 0x44:
    goto switchD_0033e46e_caseD_44;
  case 0x45:
    member_00 = (ConfigBlockSymbol *)
                CheckerSymbol::fromSyntax(this,(CheckerDeclarationSyntax *)syntax);
    goto LAB_0033e5b0;
  default:
    goto switchD_0033e5f2_caseD_144;
  case 0x47:
  case 0x4e:
  case 0x50:
  case 0x68:
  case 0x6a:
  case 0x7b:
  case 0x7f:
    goto switchD_0033e5f2_caseD_142;
  case 0x48:
    member_00 = (ConfigBlockSymbol *)ClassType::fromSyntax(this,(ClassDeclarationSyntax *)syntax);
    goto LAB_0033e5b0;
  case 0x49:
    TVar22 = slang::syntax::SyntaxNode::getLastToken
                       (*(SyntaxNode **)(syntax[5].previewNode[3].parent + 5));
    if (TVar22.kind == NewKeyword) goto switchD_0033e5f2_caseD_142;
    member_00 = (ConfigBlockSymbol *)
                SubroutineSymbol::fromSyntax
                          (this->compilation,(ClassMethodDeclarationSyntax *)syntax,this);
    goto LAB_0033efda;
  case 0x4a:
    member_00 = (ConfigBlockSymbol *)
                MethodPrototypeSymbol::fromSyntax(this,(ClassMethodPrototypeSyntax *)syntax);
    goto LAB_0033e5b0;
  case 0x4c:
    SVar2 = (((ParameterDeclarationStatementSyntax *)syntax[5].previewNode)->super_MemberSyntax).
            super_SyntaxNode.kind;
    if ((int)SVar2 < 0x15f) {
      if (SVar2 == DataDeclaration) {
        unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
        local_98[0].len = 0;
        local_98[0].data_ = (pointer)unaff_R15;
        local_98[0].cap = 5;
        ClassPropertySymbol::fromSyntax
                  (this,(ClassPropertyDeclarationSyntax *)syntax,
                   (SmallVectorBase<const_slang::ast::ClassPropertySymbol_*> *)local_98);
        pFVar17 = (ForwardingTypedefSymbol *)local_98;
        if ((char *)local_98[0].len != (char *)0x0) {
          ppSVar5 = local_98[0].data_;
          lVar19 = local_98[0].len << 3;
          lVar18 = 0;
          do {
            insertMember(this,*(Symbol **)((long)ppSVar5 + lVar18),this->lastMember,false,true);
            lVar18 = lVar18 + 8;
            pFVar17 = (ForwardingTypedefSymbol *)local_98;
          } while (lVar19 != lVar18);
        }
        goto LAB_0033ef8c;
      }
      if (SVar2 != ForwardTypedefDeclaration) {
        return;
      }
      local_98[0].data_ =
           (pointer)ForwardingTypedefSymbol::fromSyntax
                              (this,(ClassPropertyDeclarationSyntax *)syntax);
      goto LAB_0033edad;
    }
    if (SVar2 != ParameterDeclarationStatement) {
      if (SVar2 != TypedefDeclaration) {
        return;
      }
      member_00 = (ConfigBlockSymbol *)
                  TypeAliasType::fromSyntax(this,(ClassPropertyDeclarationSyntax *)syntax);
      goto LAB_0033e5b0;
    }
    local_98[0].len = 0;
    local_98[0].data_ = (pointer)((long)local_98 + 0x18U);
    local_98[0].cap = 5;
    ParameterSymbolBase::fromLocalSyntax
              (this,(ParameterDeclarationStatementSyntax *)syntax[5].previewNode,
               (SmallVectorBase<slang::ast::Symbol_*> *)local_98);
    if ((char *)local_98[0].len != (char *)0x0) {
      ppSVar5 = local_98[0].data_;
      lVar19 = local_98[0].len << 3;
      lVar18 = 0;
      do {
        insertMember(this,*(Symbol **)((long)ppSVar5 + lVar18),this->lastMember,false,true);
        lVar18 = lVar18 + 8;
      } while (lVar19 != lVar18);
    }
    pFVar15 = (ForwardingTypedefSymbol *)local_98[0].data_;
    if ((ForwardingTypedefSymbol *)local_98[0].data_ ==
        (ForwardingTypedefSymbol *)((long)local_98 + 0x18U)) {
      return;
    }
    goto LAB_0033ef95;
  case 0x57:
    member_00 = (ConfigBlockSymbol *)
                ProceduralBlockSymbol::fromSyntax(this,(ConcurrentAssertionMemberSyntax *)syntax);
    goto LAB_0033e5b0;
  case 0x5a:
    member_00 = (ConfigBlockSymbol *)
                TimingPathSymbol::fromSyntax(this,(ConditionalPathDeclarationSyntax *)syntax);
    goto LAB_0033e5b0;
  case 0x60:
    member_00 = Compilation::createConfigBlock
                          (this->compilation,this,(ConfigDeclarationSyntax *)syntax);
    goto LAB_0033e5b0;
  case 0x65:
    member_00 = (ConfigBlockSymbol *)
                ConstraintBlockSymbol::fromSyntax(this,(ConstraintDeclarationSyntax *)syntax);
LAB_0033efda:
    if (member_00 == (ConfigBlockSymbol *)0x0) {
      return;
    }
    goto LAB_0033e5b0;
  case 0x66:
    member_00 = (ConfigBlockSymbol *)
                ConstraintBlockSymbol::fromSyntax(this,(ConstraintPrototypeSyntax *)syntax);
    goto LAB_0033e5b0;
  case 0x6d:
    member_00 = (ConfigBlockSymbol *)
                CoverageBinSymbol::fromSyntax(this,(CoverageBinsSyntax *)syntax);
    goto LAB_0033e5b0;
  case 0x71:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_98[0].len;
    local_98[0]._0_16_ = auVar4 << 0x40;
    member_01 = CovergroupType::fromSyntax
                          (this,(CovergroupDeclarationSyntax *)syntax,(Symbol **)local_98);
    insertMember(this,(Symbol *)member_01,this->lastMember,false,true);
    if ((ForwardingTypedefSymbol *)local_98[0].data_ == (ForwardingTypedefSymbol *)0x0) {
      return;
    }
    insertMember(this,(Symbol *)local_98[0].data_,this->lastMember,false,true);
    return;
  case 0x72:
    member_00 = (ConfigBlockSymbol *)CoverpointSymbol::fromSyntax(this,(CoverpointSyntax *)syntax);
    goto LAB_0033e5b0;
  case 0x74:
    Compilation::noteDPIExportDirective(this->compilation,(DPIExportSyntax *)syntax,this);
    return;
  case 0x75:
    member_00 = (ConfigBlockSymbol *)
                SubroutineSymbol::fromSyntax(this->compilation,(DPIImportSyntax *)syntax,this);
    goto LAB_0033e5b0;
  case 0x76:
    if ((((syntax[5].previewNode)->kind == NamedType) && (syntax[5].parent == (SyntaxNode *)0x0)) &&
       (bVar6 = handleDataDeclaration(this,(DataDeclarationSyntax *)syntax), bVar6)) {
      return;
    }
    unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
    local_98[0].len = 0;
    local_98[0].data_ = (pointer)unaff_R15;
    local_98[0].cap = 5;
    VariableSymbol::fromSyntax
              (this->compilation,(DataDeclarationSyntax *)syntax,this,false,
               (SmallVectorBase<slang::ast::VariableSymbol_*> *)local_98);
    pFVar17 = (ForwardingTypedefSymbol *)local_98;
    if ((char *)local_98[0].len == (char *)0x0) goto LAB_0033ef8c;
    uVar13 = local_98[0].len << 3;
    syntax = (SyntaxNode *)local_98[0].data_;
    break;
  case 0x78:
    unaff_R15 = (ForwardingTypedefSymbol *)((long)local_98 + 0x18);
    local_98[0].len = 0;
    local_98[0].data_ = (pointer)unaff_R15;
    local_98[0].cap = 5;
    DefParamSymbol::fromSyntax
              (this,(DefParamSyntax *)syntax,
               (SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)local_98);
    pFVar17 = (ForwardingTypedefSymbol *)local_98;
    if ((char *)local_98[0].len != (char *)0x0) {
      ppSVar5 = local_98[0].data_;
      lVar19 = local_98[0].len << 3;
      lVar18 = 0;
      do {
        insertMember(this,*(Symbol **)((long)ppSVar5 + lVar18),this->lastMember,false,true);
        lVar18 = lVar18 + 8;
        pFVar17 = (ForwardingTypedefSymbol *)local_98;
      } while (lVar19 != lVar18);
    }
    goto LAB_0033ef8c;
  case 0x80:
    if ((POPCOUNT((ulong)puVar8 & 0xff) & 1U) != 0) {
      halt_baddata();
    }
    goto switchD_0033e5f2_caseD_145;
  case 0x81:
  case 0x82:
    goto switchD_0033e46e_caseD_81;
  case 0x83:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x95:
  case 0x96:
  case 0x97:
    in(0xf5);
    halt_baddata();
  case 0x84:
    goto code_r0x0033e4b7;
  case 0x8d:
    this_01 = (Token *)((ulong)this & 0xffffffff);
    do {
      local_98[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(this_01);
      SVar11 = parsing::Token::location((Token *)unaff_R13);
      local_58._M_len = (size_t)SVar11;
      this = (Scope *)BumpAllocator::
                      emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                                ((BumpAllocator *)this,
                                 (basic_string_view<char,_std::char_traits<char>_> *)local_98,
                                 (SourceLocation *)&local_58);
      (((ExplicitImportSymbol *)this)->super_Symbol).originatingSyntax = (SyntaxNode *)unaff_RBX;
      Symbol::setAttributes
                ((Symbol *)this,(Scope *)syntax,
                 *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   *)((long)(local_48 + 2) + 0x10));
      psVar12 = &((ExplicitImportSymbol *)this)->importName;
      while( true ) {
        *(bool *)&psVar12->_M_len = true;
        lVar19 = unaff_R12;
switchD_0033e46e_caseD_93:
        insertMember((Scope *)syntax,(Symbol *)this,(Symbol *)syntax[1].parent,false,true);
        unaff_R12 = lVar19 + 0x30;
        unaff_R15 = (ForwardingTypedefSymbol *)((long)(unaff_R15 + 0xffffffffffffffff) + 0x57);
        if (unaff_R15 == (ForwardingTypedefSymbol *)0x0) {
          return;
        }
        ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              ((long)(*(SyntaxNode **)((long)(local_48 + 5) + 0x10) + 2) + lVar19));
        unaff_RBX = (Scope *)*ppSVar10;
        unaff_R13 = unaff_RBX + 1;
        this_01 = (Token *)&unaff_RBX->firstMember;
        this = *(Scope **)syntax;
        if (*(short *)&unaff_RBX[1].compilation == 0x1b) break;
        local_98[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(this_01);
        local_58 = parsing::Token::valueText((Token *)unaff_R13);
        local_40 = parsing::Token::location((Token *)unaff_R13);
        this = (Scope *)BumpAllocator::
                        emplace<slang::ast::ExplicitImportSymbol,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                                  ((BumpAllocator *)this,
                                   (basic_string_view<char,_std::char_traits<char>_> *)local_98,
                                   &local_58,&local_40);
        (((ExplicitImportSymbol *)this)->super_Symbol).originatingSyntax = (SyntaxNode *)unaff_RBX;
        Symbol::setAttributes
                  ((Symbol *)this,(Scope *)syntax,
                   *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                     *)((long)(local_48 + 2) + 0x10));
        psVar12 = (string_view *)&((ExplicitImportSymbol *)this)->isFromExport;
      }
    } while( true );
  case 0x8e:
    pcVar14 = (char *)(ulong)(uint)((int)unaff_RBX << 3);
    goto code_r0x0033e6b0;
  case 0x92:
  case 0x98:
    goto LAB_0033eb48;
  case 0x93:
    goto switchD_0033e46e_caseD_93;
  case 0x94:
switchD_0033e46e_caseD_94:
    member_00 = (ConfigBlockSymbol *)ElabSystemTaskSymbol::fromSyntax(compilation,syntax_00);
    goto LAB_0033e5b0;
  case 0x99:
  case 0xa0:
    halt_baddata();
  case 0x9a:
    piVar1 = (int *)((long)&UINT_004cd15c +
                    (long)(int)(&switchD_0033e46e::switchdataD_004cd1d4)[iVar7 - 0x44] + 3);
    *piVar1 = *piVar1 + -1;
    pFVar15 = (ForwardingTypedefSymbol *)local_98[0].data_;
    goto code_r0x0033e4a6;
  case 0x9b:
  case 0x9d:
  case 0x9e:
  case 0x9f:
    uVar13 = (ulong)(uint)((int)unaff_RBX << 3);
    break;
  case 0x9c:
    goto switchD_0033e5f2_caseD_142;
  case 0xa1:
    *(char *)puVar8 = (char)*puVar8 + (char)puVar8;
    goto code_r0x0033e40d;
  case 0xa2:
    lVar19 = 0;
    do {
      insertMember(this,*(Symbol **)(lVar19 + (long)&syntax->kind),this->lastMember,false,true);
      lVar19 = lVar19 + 8;
      pFVar17 = (ForwardingTypedefSymbol *)local_98;
    } while (unaff_RBX != (Scope *)lVar19);
    goto LAB_0033ef8c;
  case 0xa3:
    do {
      this_00 = BumpAllocator::
                emplace<slang::ast::ExplicitImportSymbol,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                          (&local_38->super_BumpAllocator,
                           (basic_string_view<char,_std::char_traits<char>_> *)local_98,&local_58,
                           &local_40);
      (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)this;
      Symbol::setAttributes
                (&this_00->super_Symbol,unaff_RBX,
                 *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   *)&syntax[2].previewNode);
      insertMember(unaff_RBX,&this_00->super_Symbol,unaff_RBX->lastMember,false,true);
      lVar19 = unaff_R12;
      while( true ) {
        unaff_R12 = lVar19 + 0x30;
        unaff_R13 = (Scope *)((long)&unaff_R13[-1].importData + 7);
        if (unaff_R13 == (Scope *)0x0) {
          return;
        }
        ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              ((long)&syntax[5].previewNode[2].kind + lVar19));
        this = (Scope *)*ppSVar10;
        if ((((PackageImportItemSyntax *)this)->item).kind != Star) break;
        addWildcardImport(unaff_RBX,(PackageImportItemSyntax *)this,
                          *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                            *)&syntax[2].previewNode);
        lVar19 = unaff_R12;
      }
      local_38 = unaff_RBX->compilation;
      local_98[0]._0_16_ =
           (undefined1  [16])parsing::Token::valueText(&((PackageImportItemSyntax *)this)->package);
      local_58 = parsing::Token::valueText(&((PackageImportItemSyntax *)this)->item);
      local_40 = parsing::Token::location(&((PackageImportItemSyntax *)this)->item);
    } while( true );
  }
  uVar20 = 0;
  do {
    insertMember(this,*(Symbol **)
                       ((long)&(((ForwardingTypedefSymbol *)syntax)->super_Symbol).kind + uVar20),
                 this->lastMember,false,true);
    uVar20 = uVar20 + 8;
    pFVar17 = (ForwardingTypedefSymbol *)local_98;
  } while (uVar13 != uVar20);
LAB_0033ef8c:
  pFVar15 = *(ForwardingTypedefSymbol **)pFVar17;
  if (*(ForwardingTypedefSymbol **)pFVar17 != unaff_R15) {
LAB_0033ef95:
    *(undefined8 *)((long)pFVar17 + -8) = 0x33ef9a;
    operator_delete(pFVar15);
  }
  return;
}

Assistant:

void Scope::addMembers(const SyntaxNode& syntax) {
    if (syntax.previewNode)
        addMembers(*syntax.previewNode);

    switch (syntax.kind) {
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ProgramDeclaration: {
            // Definitions exist in their own namespace and are tracked in the Compilation.
            LookupLocation ll(this, lastMember ? uint32_t(lastMember->getIndex()) + 1 : 1);
            compilation.createDefinition(*this, ll, syntax.as<ModuleDeclarationSyntax>());

            if (thisSym->kind != SymbolKind::Root && thisSym->kind != SymbolKind::CompilationUnit &&
                syntax.kind != SyntaxKind::InterfaceDeclaration) {
                addDeferredMembers(syntax);
            }
            break;
        }
        case SyntaxKind::PackageDeclaration: {
            // Packages exist in their own namespace and are tracked in the Compilation.
            auto& package = compilation.createPackage(*this, syntax.as<ModuleDeclarationSyntax>());
            addMember(package);
            break;
        }
        case SyntaxKind::UdpDeclaration:
            // Primitives exist in their own namespace and are tracked in the Compilation.
            compilation.createPrimitive(*this, syntax.as<UdpDeclarationSyntax>());
            break;
        case SyntaxKind::ConfigDeclaration:
            // Config blocks exist in their own namespace and are tracked in the Compilation.
            addMember(compilation.createConfigBlock(*this, syntax.as<ConfigDeclarationSyntax>()));
            break;
        case SyntaxKind::PackageImportDeclaration: {
            auto& importDecl = syntax.as<PackageImportDeclarationSyntax>();
            for (auto item : importDecl.items) {
                if (item->item.kind == TokenKind::Star) {
                    addWildcardImport(*item, importDecl.attributes);
                }
                else {
                    auto import = compilation.emplace<ExplicitImportSymbol>(
                        item->package.valueText(), item->item.valueText(), item->item.location());

                    import->setSyntax(*item);
                    import->setAttributes(*this, importDecl.attributes);
                    addMember(*import);
                }
            }
            break;
        }
        case SyntaxKind::PackageExportDeclaration: {
            auto& exportDecl = syntax.as<PackageExportDeclarationSyntax>();
            for (auto item : exportDecl.items) {
                if (item->item.kind == TokenKind::Star) {
                    // These are handled manually as "wildcard imports" but don't get
                    // added to the import list. This is done just so that the package
                    // name itself gets validated and the attributes have somewhere to live.
                    // The actual export functionality is handled in PackageSymbol.
                    auto import = compilation.emplace<WildcardImportSymbol>(
                        item->package.valueText(), item->item.location());

                    import->setSyntax(*item);
                    import->setAttributes(*this, exportDecl.attributes);
                    import->isFromExport = true;
                    addMember(*import);
                }
                else {
                    auto import = compilation.emplace<ExplicitImportSymbol>(
                        item->package.valueText(), item->item.valueText(), item->item.location());

                    import->setSyntax(*item);
                    import->setAttributes(*this, exportDecl.attributes);
                    import->isFromExport = true;
                    addMember(*import);
                }
            }
            break;
        }
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::PrimitiveInstantiation:
        case SyntaxKind::CheckerInstantiation:
        case SyntaxKind::AnsiPortList:
        case SyntaxKind::NonAnsiPortList:
        case SyntaxKind::IfGenerate:
        case SyntaxKind::CaseGenerate:
        case SyntaxKind::LoopGenerate:
        case SyntaxKind::GenerateBlock:
        case SyntaxKind::ContinuousAssign:
        case SyntaxKind::ModportDeclaration:
        case SyntaxKind::ClockingItem:
        case SyntaxKind::DefaultClockingReference:
        case SyntaxKind::DefaultDisableDeclaration:
        case SyntaxKind::SpecifyBlock:
        case SyntaxKind::CoverCross:
        case SyntaxKind::NetAlias:
        case SyntaxKind::BindDirective:
        case SyntaxKind::ClockingDeclaration:
            addDeferredMembers(syntax);
            break;
        case SyntaxKind::EnumType:
            addDeferredMembers(syntax);
            getOrAddDeferredData().hasEnums = true;
            break;
        case SyntaxKind::PortDeclaration:
            addDeferredMembers(syntax);
            getOrAddDeferredData().addPortDeclaration(syntax, lastMember);
            break;
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::TaskDeclaration: {
            auto [subroutine, isExternIfaceMethod] = SubroutineSymbol::fromSyntax(
                compilation, syntax.as<FunctionDeclarationSyntax>(), *this, /* outOfBlock */ false);

            if (subroutine)
                addMember(*subroutine);

            if (isExternIfaceMethod)
                getOrAddDeferredData().isUncacheable = true;
            break;
        }
        case SyntaxKind::DataDeclaration: {
            // If this declaration has a named type we need to do a lookup here to see if it's
            // actually a user-defined nettype or a non-ansi interface port declaration.
            auto& dataDecl = syntax.as<DataDeclarationSyntax>();
            if (dataDecl.type->kind == SyntaxKind::NamedType && dataDecl.modifiers.empty()) {
                if (handleDataDeclaration(dataDecl))
                    break;
            }

            SmallVector<VariableSymbol*> symbols;
            VariableSymbol::fromSyntax(compilation, dataDecl, *this, /* isCheckerFreeVar */ false,
                                       symbols);
            for (auto symbol : symbols)
                addMember(*symbol);
            break;
        }
        case SyntaxKind::UserDefinedNetDeclaration:
            handleUserDefinedNet(syntax.as<UserDefinedNetDeclarationSyntax>());
            break;
        case SyntaxKind::NetDeclaration: {
            SmallVector<const NetSymbol*> nets;
            NetSymbol::fromSyntax(*this, syntax.as<NetDeclarationSyntax>(), nets);
            for (auto net : nets)
                addMember(*net);
            break;
        }
        case SyntaxKind::CheckerDataDeclaration: {
            SmallVector<VariableSymbol*> symbols;
            VariableSymbol::fromSyntax(compilation, *syntax.as<CheckerDataDeclarationSyntax>().data,
                                       *this, /* isCheckerFreeVar */ true, symbols);
            for (auto symbol : symbols)
                addMember(*symbol);
            break;
        }
        case SyntaxKind::ParameterDeclarationStatement: {
            SmallVector<Symbol*> params;
            ParameterSymbolBase::fromLocalSyntax(*this,
                                                 syntax.as<ParameterDeclarationStatementSyntax>(),
                                                 params);
            for (auto param : params)
                addMember(*param);
            break;
        }
        case SyntaxKind::AlwaysBlock:
        case SyntaxKind::AlwaysCombBlock:
        case SyntaxKind::AlwaysLatchBlock:
        case SyntaxKind::AlwaysFFBlock:
        case SyntaxKind::InitialBlock:
        case SyntaxKind::FinalBlock:
            addMember(ProceduralBlockSymbol::fromSyntax(*this, syntax.as<ProceduralBlockSyntax>()));
            break;
        case SyntaxKind::ConcurrentAssertionMember:
            addMember(ProceduralBlockSymbol::fromSyntax(
                *this, syntax.as<ConcurrentAssertionMemberSyntax>()));
            break;
        case SyntaxKind::ImmediateAssertionMember:
            addMember(ProceduralBlockSymbol::fromSyntax(
                *this, syntax.as<ImmediateAssertionMemberSyntax>()));
            break;
        case SyntaxKind::EmptyMember:
            addMember(
                EmptyMemberSymbol::fromSyntax(compilation, *this, syntax.as<EmptyMemberSyntax>()));
            break;
        case SyntaxKind::TypedefDeclaration:
            addMember(TypeAliasType::fromSyntax(*this, syntax.as<TypedefDeclarationSyntax>()));
            break;
        case SyntaxKind::ForwardTypedefDeclaration: {
            auto& symbol = ForwardingTypedefSymbol::fromSyntax(
                *this, syntax.as<ForwardTypedefDeclarationSyntax>());
            addMember(symbol);
            getOrAddDeferredData().addForwardingTypedef(symbol);
            break;
        }
        case SyntaxKind::GenerateRegion:
            for (auto member : syntax.as<GenerateRegionSyntax>().members)
                addMembers(*member);
            break;
        case SyntaxKind::NetTypeDeclaration:
            addMember(NetType::fromSyntax(*this, syntax.as<NetTypeDeclarationSyntax>()));
            break;
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::PackageExportAllDeclaration:
            // These are handled elsewhere; just ignore here.
            break;
        case SyntaxKind::GenvarDeclaration: {
            SmallVector<const GenvarSymbol*> genvars;
            GenvarSymbol::fromSyntax(*this, syntax.as<GenvarDeclarationSyntax>(), genvars);
            for (auto genvar : genvars)
                addMember(*genvar);
            break;
        }
        case SyntaxKind::ClassDeclaration:
            addMember(ClassType::fromSyntax(*this, syntax.as<ClassDeclarationSyntax>()));
            break;
        case SyntaxKind::ClassPropertyDeclaration: {
            auto& cpd = syntax.as<ClassPropertyDeclarationSyntax>();
            switch (cpd.declaration->kind) {
                case SyntaxKind::DataDeclaration: {
                    SmallVector<const ClassPropertySymbol*> symbols;
                    ClassPropertySymbol::fromSyntax(*this, cpd, symbols);
                    for (auto symbol : symbols)
                        addMember(*symbol);
                    break;
                }
                case SyntaxKind::TypedefDeclaration:
                    addMember(TypeAliasType::fromSyntax(*this, cpd));
                    break;
                case SyntaxKind::ForwardTypedefDeclaration: {
                    auto& symbol = ForwardingTypedefSymbol::fromSyntax(*this, cpd);
                    addMember(symbol);
                    getOrAddDeferredData().addForwardingTypedef(symbol);
                    break;
                }
                case SyntaxKind::ParameterDeclarationStatement: {
                    SmallVector<Symbol*> params;
                    ParameterSymbolBase::fromLocalSyntax(
                        *this, cpd.declaration->as<ParameterDeclarationStatementSyntax>(), params);
                    for (auto param : params)
                        addMember(*param);
                    break;
                }
                default:
                    // All other possible member kinds here are illegal and will
                    // be diagnosed in the parser, so just ignore them.
                    break;
            }
            break;
        }
        case SyntaxKind::ClassMethodDeclaration: {
            // Constructors need to be deferred because they may need to
            // inherit arguments from their base class.
            auto& cmds = syntax.as<ClassMethodDeclarationSyntax>();
            if (cmds.declaration->prototype->name->getLastToken().kind == TokenKind::NewKeyword)
                addDeferredMembers(syntax);
            else if (auto subroutine = SubroutineSymbol::fromSyntax(compilation, cmds, *this))
                addMember(*subroutine);
            break;
        }
        case SyntaxKind::ClassMethodPrototype:
            addMember(
                MethodPrototypeSymbol::fromSyntax(*this, syntax.as<ClassMethodPrototypeSyntax>()));
            break;
        case SyntaxKind::ElabSystemTask:
            addMember(
                ElabSystemTaskSymbol::fromSyntax(compilation, syntax.as<ElabSystemTaskSyntax>()));
            break;
        case SyntaxKind::DPIImport:
            addMember(
                SubroutineSymbol::fromSyntax(compilation, syntax.as<DPIImportSyntax>(), *this));
            break;
        case SyntaxKind::DPIExport:
            compilation.noteDPIExportDirective(syntax.as<DPIExportSyntax>(), *this);
            break;
        case SyntaxKind::ConstraintDeclaration:
            if (auto sym = ConstraintBlockSymbol::fromSyntax(
                    *this, syntax.as<ConstraintDeclarationSyntax>())) {
                addMember(*sym);
            }
            break;
        case SyntaxKind::ConstraintPrototype:
            addMember(
                ConstraintBlockSymbol::fromSyntax(*this, syntax.as<ConstraintPrototypeSyntax>()));
            break;
        case SyntaxKind::DefParam: {
            SmallVector<const DefParamSymbol*> defparams;
            DefParamSymbol::fromSyntax(*this, syntax.as<DefParamSyntax>(), defparams);
            for (auto defparam : defparams)
                addMember(*defparam);
            break;
        }
        case SyntaxKind::SpecparamDeclaration: {
            SmallVector<const SpecparamSymbol*> params;
            SpecparamSymbol::fromSyntax(*this, syntax.as<SpecparamDeclarationSyntax>(), params);
            for (auto param : params)
                addMember(*param);
            break;
        }
        case SyntaxKind::SequenceDeclaration:
            addMember(SequenceSymbol::fromSyntax(*this, syntax.as<SequenceDeclarationSyntax>()));
            break;
        case SyntaxKind::PropertyDeclaration:
            addMember(PropertySymbol::fromSyntax(*this, syntax.as<PropertyDeclarationSyntax>()));
            break;
        case SyntaxKind::LetDeclaration:
            addMember(LetDeclSymbol::fromSyntax(*this, syntax.as<LetDeclarationSyntax>()));
            break;
        case SyntaxKind::CheckerDeclaration:
            addMember(CheckerSymbol::fromSyntax(*this, syntax.as<CheckerDeclarationSyntax>()));
            break;
        case SyntaxKind::CovergroupDeclaration: {
            const Symbol* classProperty = nullptr;
            addMember(CovergroupType::fromSyntax(*this, syntax.as<CovergroupDeclarationSyntax>(),
                                                 classProperty));
            if (classProperty)
                addMember(*classProperty);
            break;
        }
        case SyntaxKind::Coverpoint:
            addMember(CoverpointSymbol::fromSyntax(*this, syntax.as<CoverpointSyntax>()));
            break;
        case SyntaxKind::CoverageBins:
            addMember(CoverageBinSymbol::fromSyntax(*this, syntax.as<CoverageBinsSyntax>()));
            break;
        case SyntaxKind::BinsSelection:
            addMember(CoverageBinSymbol::fromSyntax(*this, syntax.as<BinsSelectionSyntax>()));
            break;
        case SyntaxKind::ExternInterfaceMethod:
            addMember(
                MethodPrototypeSymbol::fromSyntax(*this, syntax.as<ExternInterfaceMethodSyntax>()));
            break;
        case SyntaxKind::PathDeclaration:
            addMember(TimingPathSymbol::fromSyntax(*this, syntax.as<PathDeclarationSyntax>()));
            break;
        case SyntaxKind::IfNonePathDeclaration:
            addMember(
                TimingPathSymbol::fromSyntax(*this, syntax.as<IfNonePathDeclarationSyntax>()));
            break;
        case SyntaxKind::ConditionalPathDeclaration:
            addMember(
                TimingPathSymbol::fromSyntax(*this, syntax.as<ConditionalPathDeclarationSyntax>()));
            break;
        case SyntaxKind::PulseStyleDeclaration:
            addMember(
                PulseStyleSymbol::fromSyntax(*this, syntax.as<PulseStyleDeclarationSyntax>()));
            break;
        case SyntaxKind::SystemTimingCheck:
            addMember(
                SystemTimingCheckSymbol::fromSyntax(*this, syntax.as<SystemTimingCheckSyntax>()));
            break;
        case SyntaxKind::AnonymousProgram:
            addMember(
                AnonymousProgramSymbol::fromSyntax(*this, syntax.as<AnonymousProgramSyntax>()));
            break;
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::ExternUdpDecl:
            compilation.noteExternDefinition(*this, syntax);
            break;
        case SyntaxKind::WildcardPortList:
            // If we hit this case we've run into an error elsewhere.
            // Just silently ignore it here.
            break;
        case SyntaxKind::LibraryDeclaration:
        case SyntaxKind::LibraryIncludeStatement:
            // These are ignored here, they're only processed during
            // library map construction.
            break;
        default:
            SLANG_UNREACHABLE;
    }
}